

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O2

void __thiscall OpenMD::ifstrstream::ifstrstream(ifstrstream *this)

{
  std::ios::ios((ios *)&this->field_0x170);
  std::istream::istream(this,(streambuf *)&PTR_construction_vtable_24__002bec40);
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)&PTR__ifstrstream_002bec00;
  *(undefined ***)&this->field_0x170 = &PTR__ifstrstream_002bec28;
  std::__cxx11::stringbuf::stringbuf
            ((stringbuf *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10);
  std::filebuf::filebuf
            ((filebuf *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x78);
  this->isRead = false;
  std::ios::init((streambuf *)
                 ((long)&(this->super_basic_istream<char,_std::char_traits<char>_>).
                         _vptr_basic_istream +
                 (long)(this->super_basic_istream<char,_std::char_traits<char>_>).
                       _vptr_basic_istream[-3]));
  return;
}

Assistant:

ifstrstream::ifstrstream() :
      std::basic_istream<char, std::char_traits<char>>(0), internalFileBuf_(),
      isRead(false) {
    this->init(&internalFileBuf_);
  }